

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peleenetssd_seg.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  float fVar5;
  uint uVar6;
  int *piVar7;
  pointer pOVar8;
  Allocator *pAVar9;
  void *__ptr;
  int iVar10;
  int iVar11;
  char cVar12;
  int iVar13;
  float fVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  float fVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  __m128 t_2;
  __m128 t;
  int baseLine;
  Extractor ex;
  vector<Object,_std::allocator<Object>_> objects;
  Mat local_368;
  Allocator *local_318;
  int *local_310;
  ulong local_308;
  float norm_vals [3];
  float mean_vals [3];
  float local_2e0;
  int local_2dc;
  Object object;
  Mat local_288;
  Mat image;
  undefined4 local_230;
  int iStack_22c;
  size_t local_228;
  Allocator *local_218;
  long *local_1f0;
  Option local_1d8;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net peleenet;
  
  if (argc == 2) {
    pcVar4 = argv[1];
    std::__cxx11::string::string((string *)&peleenet,pcVar4,(allocator *)&image);
    cv::imread((string *)&m,(int)&peleenet);
    if ((Allocator **)peleenet._vptr_Net != &peleenet.opt.blob_allocator) {
      operator_delete(peleenet._vptr_Net);
    }
    cVar12 = cv::Mat::empty();
    if (cVar12 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288._20_8_ = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      ncnn::Net::Net(&peleenet);
      peleenet.opt.use_vulkan_compute = true;
      iVar13 = ncnn::Net::load_param(&peleenet,"pelee.param");
      if ((iVar13 != 0) || (iVar13 = ncnn::Net::load_model(&peleenet,"pelee.bin"), iVar13 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,2,local_18c,local_190,0x130,0x130,(Allocator *)0x0);
      mean_vals[0] = 103.9;
      mean_vals[1] = 116.7;
      mean_vals[2] = 123.6;
      norm_vals[0] = 0.017;
      norm_vals[1] = 0.017;
      norm_vals[2] = 0.017;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      local_368.cstep = 0;
      local_368.data = (size_t *)0x0;
      local_368.refcount._0_4_ = 0;
      local_368.refcount._4_1_ = false;
      local_368.refcount._5_1_ = false;
      local_368.refcount._6_1_ = false;
      local_368.refcount._7_1_ = false;
      local_368.elemsize._0_1_ = false;
      local_368.elemsize._1_1_ = false;
      local_368.elemsize._2_1_ = false;
      local_368.elemsize._3_1_ = false;
      local_368.elemsize._4_1_ = false;
      local_368.elemsize._5_1_ = false;
      local_368.elemsize._6_1_ = false;
      local_368.elemsize._7_1_ = false;
      local_368.elempack = 0;
      local_368.allocator = (Allocator *)0x0;
      local_368.dims = 0;
      local_368.w = 0;
      local_368.h = 0;
      local_368.d = 0;
      local_368.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_368,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < local_368.h) {
        local_308 = CONCAT44(local_308._4_4_,(float)local_190);
        lVar22 = 0;
        do {
          lVar17 = local_368.w * lVar22 *
                   CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
          object.label = (int)*(float *)((long)local_368.data + lVar17);
          object.prob = *(float *)((long)local_368.data + lVar17 + 4);
          object.rect.x = *(float *)((long)local_368.data + lVar17 + 8) * (float)local_18c;
          object.rect.y = *(float *)((long)local_368.data + lVar17 + 0xc) * (float)local_308;
          object.rect.width =
               *(float *)((long)local_368.data + lVar17 + 0x10) * (float)local_18c - object.rect.x;
          object.rect.height =
               *(float *)((long)local_368.data + lVar17 + 0x14) * (float)local_308 - object.rect.y;
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,&object);
          lVar22 = lVar22 + 1;
        } while (lVar22 < local_368.h);
      }
      object.rect.x = 0.0;
      object.rect.y = 0.0;
      object.rect.width = 0.0;
      object.rect.height = 0.0;
      object.label = 0;
      object.prob = 0.0;
      ncnn::Extractor::extract(&ex,"sigmoid",(Mat *)&object,0);
      ncnn::Option::Option(&local_1d8);
      ncnn::resize_bilinear((Mat *)&object,&local_288,local_18c,local_190,&local_1d8);
      piVar7 = (int *)CONCAT44(object.rect.height,object.rect.width);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if ((*piVar7 == 0) && (object.rect._0_8_ != 0)) {
          free((void *)object.rect._0_8_);
        }
      }
      piVar7 = (int *)CONCAT44(local_368.refcount._4_4_,(int)local_368.refcount);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_368.allocator == (Allocator *)0x0) {
            if ((size_t *)local_368.data != (size_t *)0x0) {
              free(local_368.data);
            }
          }
          else {
            (*(local_368.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar7 = (int *)CONCAT44(iStack_22c,local_230);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_218 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_218->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&peleenet);
      iVar10 = local_288.h;
      iVar13 = local_288.w;
      __ptr = local_288.data;
      local_310 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      local_318 = local_288.allocator;
      uVar15 = (ulong)(uint)local_288.h;
      iVar11 = local_288.c;
      uVar26 = (ulong)(uint)local_288.c;
      if (local_310 != (int *)0x0) {
        LOCK();
        *local_310 = *local_310 + 1;
        UNLOCK();
      }
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar22 = 0;
        uVar25 = 0;
        do {
          pOVar8 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_308 = uVar25;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar22),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar22),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar22),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar22),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar22),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar22
                                  ));
          local_368.elemsize._0_1_ = false;
          local_368.elemsize._1_1_ = false;
          local_368.elemsize._2_1_ = false;
          local_368.elemsize._3_1_ = false;
          local_368.elemsize._4_1_ = false;
          local_368.elemsize._5_1_ = false;
          local_368.elemsize._6_1_ = false;
          local_368.elemsize._7_1_ = false;
          local_368.data = (void *)CONCAT44(local_368.data._4_4_,0x3010000);
          local_368.refcount = (int *)&image;
          auVar2 = *(undefined1 (*) [16])((long)&(pOVar8->rect).x + lVar22);
          ex._vptr_Extractor._0_4_ = (int)ROUND(auVar2._0_4_);
          ex._vptr_Extractor._4_4_ = (int)ROUND(auVar2._4_4_);
          ex.d._0_4_ = (int)ROUND(auVar2._8_4_);
          ex.d._4_4_ = (int)ROUND(auVar2._12_4_);
          peleenet._vptr_Net = (_func_int **)0x406fe00000000000;
          peleenet.opt.workspace_allocator = (Allocator *)0x0;
          peleenet.opt.lightmode = false;
          peleenet.opt.use_shader_pack8 = false;
          peleenet.opt.use_subgroup_ops = false;
          peleenet.opt.use_reserved_0 = false;
          peleenet.opt.num_threads = 0;
          peleenet.opt.blob_allocator = (Allocator *)0x0;
          cv::rectangle(&local_368,&ex,&peleenet,1,8,0);
          sprintf((char *)&peleenet,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar8->prob + lVar22) * 100.0),0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                  + *(int *)(
                            _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                            + (long)*(int *)((long)&pOVar8->label + lVar22) * 4));
          local_368.data = &local_368.elemsize;
          sVar16 = strlen((char *)&peleenet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_368,&peleenet,(long)&peleenet._vptr_Net + sVar16);
          cv::getTextSize((string *)norm_vals,(int)&local_368,0.5,0,(int *)0x1);
          if ((size_t *)local_368.data != &local_368.elemsize) {
            operator_delete(local_368.data);
          }
          fVar14 = (float)(int)*(float *)((long)&(pOVar8->rect).x + lVar22);
          fVar18 = (float)(int)((*(float *)((long)&(pOVar8->rect).y + lVar22) -
                                (float)(int)norm_vals[1]) - 0.0);
          if ((int)fVar18 < 1) {
            fVar18 = 0.0;
          }
          fVar5 = (float)(iStack_22c - (int)norm_vals[0]);
          if ((int)norm_vals[0] + (int)fVar14 <= iStack_22c) {
            fVar5 = fVar14;
          }
          local_1d8.workspace_allocator = (Allocator *)0x0;
          local_1d8.lightmode = false;
          local_1d8.use_shader_pack8 = false;
          local_1d8.use_subgroup_ops = true;
          local_1d8.use_reserved_0 = true;
          local_1d8.blob_allocator = (Allocator *)&image;
          mean_vals[1] = fVar18;
          mean_vals[0] = fVar5;
          mean_vals[2] = norm_vals[0];
          local_368.data = (void *)0x406fe00000000000;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_1_ = false;
          local_368.refcount._5_1_ = true;
          local_368.refcount._6_1_ = true;
          local_368.refcount._7_1_ = true;
          local_368.elemsize._0_1_ = false;
          local_368.elemsize._1_1_ = false;
          local_368.elemsize._2_1_ = false;
          local_368.elemsize._3_1_ = false;
          local_368.elemsize._4_1_ = false;
          local_368.elemsize._5_1_ = true;
          local_368.elemsize._6_1_ = true;
          local_368.elemsize._7_1_ = true;
          local_368.elempack = 0;
          local_368._28_4_ = 0;
          cv::rectangle(&local_1d8,mean_vals,&local_368,0xffffffff,8,0);
          local_1d8.workspace_allocator = (Allocator *)0x0;
          local_1d8.lightmode = false;
          local_1d8.use_shader_pack8 = false;
          local_1d8.use_subgroup_ops = true;
          local_1d8.use_reserved_0 = true;
          local_1d8.blob_allocator = (Allocator *)&image;
          local_368.data = &local_368.elemsize;
          sVar16 = strlen((char *)&peleenet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_368,&peleenet,(long)&peleenet._vptr_Net + sVar16);
          local_2dc = (int)fVar18 + (int)norm_vals[1];
          object.rect.x = 0.0;
          object.rect.y = 0.0;
          object.rect.width = 0.0;
          object.rect.height = 0.0;
          object.label = 0;
          object.prob = 0.0;
          local_2e0 = fVar5;
          cv::putText(0,&local_1d8,&local_368,&local_2e0,0,&object,1,8,0);
          uVar25 = local_308;
          if ((size_t *)local_368.data != &local_368.elemsize) {
            operator_delete(local_368.data);
          }
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 + 0x18;
        } while (uVar25 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      piVar7 = local_310;
      if (0 < iVar10) {
        uVar25 = 0;
        lVar22 = 0;
        do {
          if (0 < iVar13) {
            lVar17 = *local_1f0 * uVar25 + local_228;
            lVar22 = (long)(int)lVar22;
            lVar19 = 0;
            iVar20 = 0;
            do {
              if (0 < iVar11) {
                uVar21 = 0xffffffff;
                iVar24 = 0;
                uVar23 = 0;
                fVar14 = 0.45;
                do {
                  fVar18 = *(float *)((long)__ptr + (long)iVar24 * 4 + lVar22 * 4);
                  if (fVar14 < fVar18) {
                    uVar21 = uVar23 & 0xffffffff;
                    fVar14 = fVar18;
                  }
                  uVar23 = uVar23 + 1;
                  iVar24 = iVar24 + iVar10 * iVar13;
                } while (uVar26 != uVar23);
                if ((uint)uVar21 < 2) {
                  uVar6 = (uint)uVar21 * 3;
                  iVar24 = (&DAT_005a31c4)[uVar6];
                  iVar3 = (&DAT_005a31c8)[uVar6];
                  *(byte *)(lVar17 + lVar19) =
                       (char)((uint)((&DAT_005a31c0)[uVar6] - ((int)(&DAT_005a31c0)[uVar6] >> 0x1f))
                             >> 1) + (*(byte *)(lVar17 + lVar19) >> 1);
                  *(byte *)(lVar17 + 1 + lVar19) =
                       (char)((uint)(iVar24 - (iVar24 >> 0x1f)) >> 1) +
                       (*(byte *)(lVar17 + 1 + lVar19) >> 1);
                  *(byte *)(lVar17 + 2 + lVar19) =
                       (char)((uint)(iVar3 - (iVar3 >> 0x1f)) >> 1) +
                       (*(byte *)(lVar17 + 2 + lVar19) >> 1);
                }
              }
              lVar19 = lVar19 + 3;
              lVar22 = lVar22 + 1;
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar13);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      ppAVar1 = &peleenet.opt.blob_allocator;
      peleenet.opt.blob_allocator =
           (Allocator *)CONCAT26(peleenet.opt.blob_allocator._6_2_,0x6567616d69);
      peleenet.opt.lightmode = true;
      peleenet.opt.use_shader_pack8 = false;
      peleenet.opt.use_subgroup_ops = false;
      peleenet.opt.use_reserved_0 = false;
      peleenet.opt.num_threads = 0;
      local_368.elemsize._0_1_ = false;
      local_368.elemsize._1_1_ = false;
      local_368.elemsize._2_1_ = false;
      local_368.elemsize._3_1_ = false;
      local_368.elemsize._4_1_ = false;
      local_368.elemsize._5_1_ = false;
      local_368.elemsize._6_1_ = false;
      local_368.elemsize._7_1_ = false;
      local_368.data = (void *)CONCAT44(local_368.data._4_4_,0x1010000);
      local_368.refcount = (int *)&image;
      peleenet._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&peleenet,(_InputArray *)&local_368);
      pAVar9 = local_318;
      if ((Allocator **)peleenet._vptr_Net != ppAVar1) {
        operator_delete(peleenet._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (pAVar9 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar9->_vptr_Allocator[3])(pAVar9,__ptr);
          }
        }
      }
      piVar7 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar13 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar4);
      iVar13 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    ncnn::Mat seg_out;
    detect_peleenet(m, objects, seg_out);

    draw_objects(m, objects, seg_out);

    return 0;
}